

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  Context *context;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Options *pOVar6;
  MessageOptions *pMVar7;
  FieldDescriptor *field;
  ImmutableFieldGenerator *pIVar8;
  OneofGeneratorInfo *pOVar9;
  ClassNameResolver *this_00;
  iterator iVar10;
  string_view local_1c0;
  string local_1b0;
  string_view local_190;
  reference local_180;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_170;
  undefined1 local_168 [8];
  iterator __end3;
  undefined1 local_148 [8];
  iterator __begin3;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3;
  int local_120;
  int i;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string local_e0;
  char *local_c0;
  string_view local_b8;
  string_view local_a8;
  string local_98;
  char *local_78;
  string_view local_70;
  string_view local_60 [2];
  allocator<char> local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"OrBuilder",&local_39);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar1,true,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pOVar6 = Context::options(this->context_);
  pPVar2 = local_18;
  if ((pOVar6->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_60,"@com.google.protobuf.Internal.ProtoNonnullApi\n");
    protobuf::io::Printer::Print<>(pPVar2,local_60[0]);
  }
  iVar4 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar2 = local_18;
  if (iVar4 < 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
              );
    pMVar7 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar3 = MessageOptions::deprecated(pMVar7);
    local_c0 = anon_var_dwarf_37cdd0 + 5;
    if (bVar3) {
      local_c0 = "@java.lang.Deprecated ";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_e0,(java *)(this->super_MessageGenerator).descriptor_,
               (Descriptor *)"@java.lang.Deprecated ");
    local_f0 = Descriptor::name((this->super_MessageGenerator).descriptor_);
    protobuf::io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (pPVar2,local_b8,(char (*) [12])"deprecation",&local_c0,
               (char (*) [17])"extra_interfaces",&local_e0,(char (*) [10])0x1fb9081,&local_f0,
               (char (*) [2])0x1e6fede,(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
               (char (*) [2])0x1e7e13f,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage.\n        ExtendableMessageOrBuilder<$classname$> {\n"
              );
    pMVar7 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar3 = MessageOptions::deprecated(pMVar7);
    local_78 = anon_var_dwarf_37cdd0 + 5;
    if (bVar3) {
      local_78 = "@java.lang.Deprecated ";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_98,(java *)(this->super_MessageGenerator).descriptor_,
               (Descriptor *)"@java.lang.Deprecated ");
    local_a8 = Descriptor::name((this->super_MessageGenerator).descriptor_);
    protobuf::io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>,char[2],char[1],char[2],char[1]>
              (pPVar2,local_70,(char (*) [12])"deprecation",&local_78,
               (char (*) [17])"extra_interfaces",&local_98,(char (*) [10])0x1fb9081,&local_a8,
               (char (*) [2])0x1e6fede,(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
               (char (*) [2])0x1e7e13f,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
    std::__cxx11::string::~string((string *)&local_98);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"}");
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&i);
  protobuf::io::Printer::Annotate<google::protobuf::Descriptor>
            (pPVar2,local_100,local_110,pDVar1,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)_i);
  protobuf::io::Printer::Indent(local_18);
  local_120 = 0;
  while( true ) {
    iVar4 = local_120;
    iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    pPVar2 = local_18;
    if (iVar5 <= iVar4) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"\n");
    protobuf::io::Printer::Print<>(pPVar2,___range3);
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,local_120);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,field);
    (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[7])(pIVar8,local_18);
    local_120 = local_120 + 1;
  }
  __begin3._8_8_ = &(this->super_MessageGenerator).oneofs_;
  iVar10 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                    *)__begin3._8_8_);
  __end3._8_8_ = iVar10.node_;
  __begin3.node_._0_4_ = iVar10.position_;
  local_148 = (undefined1  [8])__end3._8_8_;
  iVar10 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                  *)__begin3._8_8_);
  kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar10.node_;
  local_170 = iVar10.position_;
  local_168 = (undefined1  [8])kv;
  __end3.node_._0_4_ = local_170;
  while( true ) {
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)local_148,(iterator *)local_168);
    if (!bVar3) break;
    local_180 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                             *)local_148);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_190,
               "\n$classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n");
    pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_180->second);
    this_00 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_1b0,this_00,(this->super_MessageGenerator).descriptor_);
    protobuf::io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
              (pPVar2,local_190,(char (*) [23])"oneof_capitalized_name",&pOVar9->capitalized_name,
               (char (*) [10])0x1fb9081,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  *)local_148);
  }
  protobuf::io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"}\n");
  protobuf::io::Printer::Print<>(pPVar2,local_1c0);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (const auto& kv : oneofs_) {
    printer->Print(
        "\n"
        "$classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(kv.second)->capitalized_name,
        "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}